

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D3MFImporter.cpp
# Opt level: O2

void __thiscall Assimp::D3MF::XmlSerializer::assignDiffuseColor(XmlSerializer *this,aiMaterial *mat)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  aiColor4D diffuse;
  
  iVar2 = (*this->xmlReader->_vptr_IIrrXMLReader[7])
                    (this->xmlReader,XmlTag::basematerials_displaycolor_abi_cxx11_);
  diffuse.r = 0.0;
  diffuse.g = 0.0;
  diffuse.b = 0.0;
  diffuse.a = 0.0;
  bVar1 = parseColor(this,(char *)CONCAT44(extraout_var,iVar2),&diffuse);
  if (bVar1) {
    aiMaterial::AddProperty<aiColor4t<float>>(mat,&diffuse,1,"$clr.diffuse",0,0);
  }
  return;
}

Assistant:

void assignDiffuseColor( aiMaterial *mat ) {
        const char *color = xmlReader->getAttributeValue( D3MF::XmlTag::basematerials_displaycolor.c_str() );
        aiColor4D diffuse;
        if ( parseColor( color, diffuse ) ) {
            mat->AddProperty<aiColor4D>( &diffuse, 1, AI_MATKEY_COLOR_DIFFUSE );
        }

    }